

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test::
TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test
          (TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).dummy.super_MemoryLeakFailure.
  _vptr_MemoryLeakFailure = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).fixture = (TestTestingFixture *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryLeakWarningTest_0034edb0;
  DummyMemoryLeakFailure::DummyMemoryLeakFailure
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).dummy);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryLeakWarningTest_0034e0a8;
  return;
}

Assistant:

TEST(MemoryLeakWarningTest, LeakWarningWithPluginDisabled)
{
    fixture->setTestFunction(testLeakWarningWithPluginDisabled_);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    fixture->runAllTests();

    LONGS_EQUAL(0, fixture->getFailureCount());
    fixture->assertPrintContains("Warning: Expected 1 leak(s), but leak detection was disabled");

    cpputest_free_location_with_leak_detection(leak1, __FILE__, __LINE__);
    leak1 = NULLPTR;

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
}